

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_hierarchy.cc
# Opt level: O0

bool lf::refinement::checkValidIndex(vector<unsigned_int,_std::allocator<unsigned_int>_> *idx_vec)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_20;
  int n;
  size_type n_idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *idx_vec_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(idx_vec);
  local_20 = 0;
  while( true ) {
    if ((uint)sVar1 <= local_20) {
      return true;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (idx_vec,(long)(int)local_20);
    if (*pvVar2 == 0xffffffff) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool checkValidIndex(const std::vector<glb_idx_t> &idx_vec) {
  const size_type n_idx = idx_vec.size();
  for (int n = 0; n < n_idx; n++) {
    if (idx_vec[n] == idx_nil) {
      return false;
    }
  }
  return true;
}